

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> * __thiscall
jessilib::string_cast<char16_t,char8_t_const*>
          (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
           *__return_storage_ptr__,jessilib *this,char8_t **in_string)

{
  char8_t *extraout_RDX;
  char8_t *pcVar1;
  size_t sVar2;
  char8_t *extraout_RDX_00;
  size_type *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar4;
  decode_result dVar5;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  InViewT in_string_view;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_50;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_40;
  
  paVar4 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = L'\0';
  local_40._M_dataplus._M_p = (pointer)paVar4;
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view
            (&local_50,*(char8_t **)this);
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  reserve(&local_40,local_50._M_len);
  psVar3 = &local_40._M_string_length;
  pcVar1 = extraout_RDX;
  do {
    if ((jessilib *)local_50._M_len == (jessilib *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_40._M_dataplus._M_p == paVar4) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT62(local_40.field_2._M_allocated_capacity._2_6_,local_40.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_40.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_40._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT62(local_40.field_2._M_allocated_capacity._2_6_,local_40.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = local_40._M_string_length;
      local_40._M_dataplus._M_p = (pointer)paVar4;
LAB_00376d47:
      *psVar3 = 0;
      paVar4->_M_local_buf[0] = L'\0';
      std::__cxx11::u16string::~u16string((u16string *)&local_40);
      return __return_storage_ptr__;
    }
    in_string_00._M_str = pcVar1;
    in_string_00._M_len = (size_t)local_50._M_str;
    dVar5 = decode_codepoint_utf8<char8_t>((jessilib *)local_50._M_len,in_string_00);
    sVar2 = dVar5.units;
    if (sVar2 == 0) {
      paVar4 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar4;
      psVar3 = &__return_storage_ptr__->_M_string_length;
      goto LAB_00376d47;
    }
    local_50._M_str = local_50._M_str + sVar2;
    local_50._M_len = local_50._M_len + -sVar2;
    encode_codepoint_utf16<char16_t,std::__cxx11::u16string>(&local_40,dVar5.codepoint);
    pcVar1 = extraout_RDX_00;
  } while( true );
}

Assistant:

std::basic_string<OutCharT> string_cast(const InT& in_string) {
	static_assert(impl_unicode::is_string<InT>::value == true);
	using InCharT = std::remove_cvref_t<typename impl_unicode::is_string<InT>::type>;
	using InEquivalentT = typename unicode_traits<InCharT>::equivalent_type;
	using InViewT = std::basic_string_view<InCharT>;
	using OutT = std::basic_string<OutCharT>;

	if constexpr (std::is_same_v<InT, OutT>) {
		// This does nothing at all; consider static_assert against this?
		return in_string;
	}
	else if constexpr (std::is_same_v<OutCharT, InCharT>
	    || std::is_same_v<OutCharT, InEquivalentT>) {
		// Just do a dumb copy when same or equivalent char types; should be faster than re-encoding
		if constexpr (impl_unicode::is_string<InT>::is_container) {
			return { reinterpret_cast<const OutCharT*>(in_string.data()), in_string.size() };
		}
		else if constexpr (impl_unicode::is_string<InT>::is_fixed_array) {
			return { reinterpret_cast<const OutCharT*>(in_string), std::size(in_string) - 1 }; // strip null term
		}
		else {
			return { reinterpret_cast<const OutCharT*>(in_string) };
		}
	}
	else {
		// Last resort: reencode the string
		std::basic_string<OutCharT> result;
		InViewT in_string_view = static_cast<InViewT>(in_string);
		if constexpr (sizeof(InCharT) <= sizeof(OutCharT)) {
			// When copying to a larger type, we will need _at most_ as many elements as the smaller storage type
			result.reserve(in_string_view.size());
		}
		else {
			result.reserve(in_string_view.size() * (sizeof(OutCharT) / sizeof(InCharT)));
		}

		while (!in_string_view.empty()) {
			decode_result string_front = decode_codepoint(in_string_view);
			if (string_front.units == 0) {
				return {};
			}
			in_string_view.remove_prefix(string_front.units);

			encode_codepoint(result, string_front.codepoint);
		}

		return result;
	}
}